

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestFixturesWithThrowingCtorsAreFailures::
TestFixturesWithThrowingCtorsAreFailures(TestFixturesWithThrowingCtorsAreFailures *this)

{
  char *suiteName;
  TestFixturesWithThrowingCtorsAreFailures *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"FixturesWithThrowingCtorsAreFailures",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestTestMacros.cpp"
             ,0x75);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestFixturesWithThrowingCtorsAreFailures_00184b80;
  return;
}

Assistant:

TEST(FixturesWithThrowingCtorsAreFailures)
{
	CHECK(throwingFixtureTestList1.GetHead() != NULL);
	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResult(result);
		throwingFixtureTestList1.GetHead()->Run();
	}

	int const failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK(strstr(reporter.lastFailedMessage, "while constructing fixture"));
}